

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,QStorageInfo *s)

{
  long lVar1;
  DataPointer *pDVar2;
  storage_type *in_RCX;
  long *in_RDX;
  char16_t *pcVar3;
  char *pcVar4;
  QString *this;
  QStorageInfoPrivate *pQVar5;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QByteArrayView ba_03;
  QByteArrayView ba_04;
  QByteArrayView ba_05;
  QByteArrayView ba_06;
  QByteArrayView ba_07;
  QByteArrayView ba_08;
  QByteArrayView ba_09;
  QDebugStateSaver saver;
  QDebugStateSaver local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_48,(QDebug *)s);
  pQVar5 = (s->d).d.ptr;
  *(undefined2 *)&(pQVar5->device).d.size = 0x100;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QStorageInfo(";
  QString::fromUtf8(&local_40,(QString *)0xd,ba);
  QTextStream::operator<<((QTextStream *)pQVar5,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar5 = (s->d).d.ptr;
  if ((char)(pQVar5->device).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar5,' ');
  }
  lVar1 = *in_RDX;
  pQVar5 = (s->d).d.ptr;
  if (*(char *)(lVar1 + 0x9e) == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar5,'\"');
    pQVar5 = (s->d).d.ptr;
    if ((char)(pQVar5->device).d.size == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar5,' ');
    }
    pcVar3 = *(char16_t **)(lVar1 + 0x10);
    if ((QChar *)pcVar3 == (QChar *)0x0) {
      pcVar3 = &QString::_empty;
    }
    QDebug::putString((QDebug *)s,(QChar *)pcVar3,*(size_t *)(lVar1 + 0x18));
    pQVar5 = (s->d).d.ptr;
    if ((char)(pQVar5->device).d.size == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar5,' ');
      pQVar5 = (s->d).d.ptr;
    }
    QTextStream::operator<<((QTextStream *)pQVar5,'\"');
    pQVar5 = (s->d).d.ptr;
    if ((char)(pQVar5->device).d.size == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar5,' ');
      pQVar5 = (s->d).d.ptr;
    }
    if (*(long *)(lVar1 + 0x60) != 0) {
      ba_00.m_data = in_RCX;
      ba_00.m_size = (qsizetype)", type=";
      QString::fromUtf8(&local_40,(QString *)&DAT_00000007,ba_00);
      QTextStream::operator<<((QTextStream *)pQVar5,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
      }
      pcVar4 = *(char **)(lVar1 + 0x58);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = &QByteArray::_empty;
      }
      in_RCX = (storage_type *)0x0;
      QDebug::putByteArray((QDebug *)s,pcVar4,*(size_t *)(lVar1 + 0x60),ContainsBinary);
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
        pQVar5 = (s->d).d.ptr;
      }
    }
    if (*(long *)(lVar1 + 0x78) != 0) {
      ba_01.m_data = in_RCX;
      ba_01.m_size = (qsizetype)", name=\"";
      QString::fromUtf8(&local_40,(QString *)0x8,ba_01);
      QTextStream::operator<<((QTextStream *)pQVar5,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
      }
      pcVar3 = *(char16_t **)(lVar1 + 0x70);
      if ((QChar *)pcVar3 == (QChar *)0x0) {
        pcVar3 = &QString::_empty;
      }
      QDebug::putString((QDebug *)s,(QChar *)pcVar3,*(size_t *)(lVar1 + 0x78));
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
        pQVar5 = (s->d).d.ptr;
      }
      QTextStream::operator<<((QTextStream *)pQVar5,'\"');
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
        pQVar5 = (s->d).d.ptr;
      }
    }
    if (*(long *)(lVar1 + 0x30) != 0) {
      ba_02.m_data = in_RCX;
      ba_02.m_size = (qsizetype)", device=\"";
      QString::fromUtf8(&local_40,(QString *)0xa,ba_02);
      QTextStream::operator<<((QTextStream *)pQVar5,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
      }
      pcVar4 = *(char **)(lVar1 + 0x28);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = &QByteArray::_empty;
      }
      in_RCX = (storage_type *)0x0;
      QDebug::putByteArray((QDebug *)s,pcVar4,*(size_t *)(lVar1 + 0x30),ContainsBinary);
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
        pQVar5 = (s->d).d.ptr;
      }
      QTextStream::operator<<((QTextStream *)pQVar5,'\"');
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
        pQVar5 = (s->d).d.ptr;
      }
    }
    if (*(long *)(lVar1 + 0x48) != 0) {
      ba_03.m_data = in_RCX;
      ba_03.m_size = (qsizetype)", subvolume=\"";
      QString::fromUtf8(&local_40,(QString *)0xd,ba_03);
      QTextStream::operator<<((QTextStream *)pQVar5,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
      }
      pcVar4 = *(char **)(lVar1 + 0x40);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = &QByteArray::_empty;
      }
      in_RCX = (storage_type *)0x0;
      QDebug::putByteArray((QDebug *)s,pcVar4,*(size_t *)(lVar1 + 0x48),ContainsBinary);
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
        pQVar5 = (s->d).d.ptr;
      }
      QTextStream::operator<<((QTextStream *)pQVar5,'\"');
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
        pQVar5 = (s->d).d.ptr;
      }
    }
    if (*(char *)(lVar1 + 0x9c) == '\x01') {
      ba_04.m_data = in_RCX;
      ba_04.m_size = (qsizetype)" [read only]";
      QString::fromUtf8(&local_40,(QString *)0xc,ba_04);
      QTextStream::operator<<((QTextStream *)pQVar5,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
        pQVar5 = (s->d).d.ptr;
      }
    }
    pcVar4 = " [not ready]";
    if (*(char *)(lVar1 + 0x9d) != '\0') {
      pcVar4 = " [ready]";
    }
    this = (QString *)0xffffffffffffffff;
    do {
      pDVar2 = &this->d;
      this = (QString *)((long)&(this->d).d + 1);
    } while ((pcVar4 + 1)[(long)&pDVar2->d] != '\0');
    ba_05.m_data = in_RCX;
    ba_05.m_size = (qsizetype)pcVar4;
    QString::fromUtf8(&local_40,this,ba_05);
    QTextStream::operator<<((QTextStream *)pQVar5,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar5 = (s->d).d.ptr;
    if ((char)(pQVar5->device).d.size == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar5,' ');
    }
    if (0 < *(long *)(lVar1 + 0x80)) {
      pQVar5 = (s->d).d.ptr;
      ba_06.m_data = in_RCX;
      ba_06.m_size = (qsizetype)", bytesTotal=";
      QString::fromUtf8(&local_40,(QString *)0xd,ba_06);
      QTextStream::operator<<((QTextStream *)pQVar5,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
        pQVar5 = (s->d).d.ptr;
      }
      QTextStream::operator<<((QTextStream *)pQVar5,*(qlonglong *)(lVar1 + 0x80));
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
        pQVar5 = (s->d).d.ptr;
      }
      ba_07.m_data = in_RCX;
      ba_07.m_size = (qsizetype)", bytesFree=";
      QString::fromUtf8(&local_40,(QString *)0xc,ba_07);
      QTextStream::operator<<((QTextStream *)pQVar5,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
        pQVar5 = (s->d).d.ptr;
      }
      QTextStream::operator<<((QTextStream *)pQVar5,*(qlonglong *)(lVar1 + 0x88));
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
        pQVar5 = (s->d).d.ptr;
      }
      ba_08.m_data = in_RCX;
      ba_08.m_size = (qsizetype)", bytesAvailable=";
      QString::fromUtf8(&local_40,(QString *)0x11,ba_08);
      QTextStream::operator<<((QTextStream *)pQVar5,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
        pQVar5 = (s->d).d.ptr;
      }
      QTextStream::operator<<((QTextStream *)pQVar5,*(qlonglong *)(lVar1 + 0x90));
      pQVar5 = (s->d).d.ptr;
      if ((char)(pQVar5->device).d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar5,' ');
      }
    }
  }
  else {
    ba_09.m_data = in_RCX;
    ba_09.m_size = (qsizetype)"invalid";
    QString::fromUtf8(&local_40,(QString *)&DAT_00000007,ba_09);
    QTextStream::operator<<((QTextStream *)pQVar5,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar5 = (s->d).d.ptr;
    if ((char)(pQVar5->device).d.size == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar5,' ');
    }
  }
  QTextStream::operator<<((QTextStream *)(s->d).d.ptr,')');
  pQVar5 = (s->d).d.ptr;
  if ((char)(pQVar5->device).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar5,' ');
    pQVar5 = (s->d).d.ptr;
  }
  (s->d).d.ptr = (QStorageInfoPrivate *)0x0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar5;
  QDebugStateSaver::~QDebugStateSaver(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QStorageInfo &s)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    debug.noquote();
    debug << "QStorageInfo(";
    if (s.isValid()) {
        const QStorageInfoPrivate *d = s.d.constData();
        debug << '"' << d->rootPath << '"';
        if (!d->fileSystemType.isEmpty())
            debug << ", type=" << d->fileSystemType;
        if (!d->name.isEmpty())
            debug << ", name=\"" << d->name << '"';
        if (!d->device.isEmpty())
            debug << ", device=\"" << d->device << '"';
        if (!d->subvolume.isEmpty())
            debug << ", subvolume=\"" << d->subvolume << '"';
        if (d->readOnly)
            debug << " [read only]";
        debug << (d->ready ? " [ready]" : " [not ready]");
        if (d->bytesTotal > 0) {
            debug << ", bytesTotal=" << d->bytesTotal << ", bytesFree=" << d->bytesFree
                  << ", bytesAvailable=" << d->bytesAvailable;
        }
    } else {
        debug << "invalid";
    }
    debug << ')';
    return debug;
}